

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_fsm.cpp
# Opt level: O0

void afsm::test::anon_unknown_7::begin_transaction(connection_fsm *fsm)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  char *in_R9;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  bool local_e1;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_b0;
  Message local_a8;
  bool local_99;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_;
  Message local_80;
  ready_for_query local_71;
  event_process_result local_70 [2];
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_40;
  begin local_31;
  event_process_result local_30 [2];
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  connection_fsm *fsm_local;
  
  poVar2 = psst::operator<<((ostream *)&std::cout,yellow);
  gtest_ar.message_.ptr_._4_4_ = std::setw(0x50);
  poVar2 = std::operator<<(poVar2,gtest_ar.message_.ptr_._4_4_);
  gtest_ar.message_.ptr_._3_1_ = std::setfill<char>('=');
  poVar2 = std::operator<<(poVar2,gtest_ar.message_.ptr_._3_1_);
  poVar2 = std::operator<<(poVar2,'=');
  std::operator<<(poVar2,"\n");
  local_30[1] = 3;
  local_30[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                ::process_event<afsm::test::events::begin>(fsm,&local_31);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_28,"event_process_result::process",
             "fsm.process_event(events::begin{})",local_30 + 1,local_30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x168,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_70[1] = 3;
  local_70[0] = state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                ::process_event<afsm::test::events::ready_for_query>(fsm,&local_71);
  testing::internal::EqHelper<false>::
  Compare<afsm::actions::event_process_result,afsm::actions::event_process_result>
            ((EqHelper<false> *)local_68,"event_process_result::process",
             "fsm.process_event(events::ready_for_query{})",local_70 + 1,local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x169,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_99 = detail::
             state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
             ::is_in_state<afsm::test::connection_fsm_def::transaction>
                       ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                         *)fsm);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_98,&local_99,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_98,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::transaction>()","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x16b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_e1 = detail::
             state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
             ::is_in_state<afsm::test::connection_fsm_def::transaction::idle>
                       ((state_machine_base_impl<afsm::test::connection_fsm_def,_std::mutex,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                         *)fsm);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e0,&local_e1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)local_e0,
               (AssertionResult *)"fsm.is_in_state<connection_fsm_def::transaction::idle>()","false"
               ,"true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zmij[P]afsm/test/transaction_fsm.cpp"
               ,0x16c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  return;
}

Assistant:

void
begin_transaction(connection_fsm& fsm)
{
    using actions::event_process_result;
    using ::psst::ansi_color;
    ::std::cout << ansi_color::yellow << ::std::setw(80) << ::std::setfill('=') << '='
            << "\n";
    // Start transaction sequence
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::begin{}));
    EXPECT_EQ(event_process_result::process, fsm.process_event(events::ready_for_query{}));

    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction>());
    EXPECT_TRUE(fsm.is_in_state<connection_fsm_def::transaction::idle>());
}